

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_socket.c
# Opt level: O2

ares_conn_err_t
ares_socket_recv(ares_channel_t *channel,ares_socket_t s,ares_bool_t is_tcp,void *data,
                size_t data_len,size_t *read_bytes)

{
  ares_conn_err_t aVar1;
  size_t sVar2;
  int *piVar3;
  
  *read_bytes = 0;
  aVar1 = ARES_CONN_ERR_SUCCESS;
  sVar2 = (*(channel->sock_funcs).arecvfrom)
                    (s,data,data_len,0,(sockaddr *)0x0,(ares_socklen_t *)0x0,
                     channel->sock_func_cb_data);
  if ((long)sVar2 < 1) {
    if (sVar2 != 0) {
      piVar3 = __errno_location();
      aVar1 = ares_socket_deref_error(*piVar3);
      return aVar1;
    }
    aVar1 = (uint)(is_tcp != ARES_FALSE) * 2;
  }
  else {
    *read_bytes = sVar2;
  }
  return aVar1;
}

Assistant:

ares_conn_err_t ares_socket_recv(ares_channel_t *channel, ares_socket_t s,
                                 ares_bool_t is_tcp, void *data,
                                 size_t data_len, size_t *read_bytes)
{
  ares_ssize_t rv;

  *read_bytes = 0;

  rv = channel->sock_funcs.arecvfrom(s, data, data_len, 0, NULL, 0,
                                     channel->sock_func_cb_data);

  if (rv > 0) {
    *read_bytes = (size_t)rv;
    return ARES_CONN_ERR_SUCCESS;
  }

  if (rv == 0) {
    /* UDP allows 0-byte packets and is connectionless, so this is success */
    if (!is_tcp) {
      return ARES_CONN_ERR_SUCCESS;
    } else {
      return ARES_CONN_ERR_CONNCLOSED;
    }
  }

  /* If we're here, rv<0 */
  return ares_socket_deref_error(SOCKERRNO);
}